

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

ProfiledInstr * __thiscall IR::ProfiledInstr::CopyProfiledInstr(ProfiledInstr *this)

{
  undefined1 *puVar1;
  ProfiledInstr *this_00;
  
  this_00 = (ProfiledInstr *)
            new<Memory::JitArenaAllocator>(0x60,((this->super_Instr).m_func)->m_alloc,0x3f1274);
  (this_00->super_Instr).m_noLazyHelperAssert = false;
  (this_00->super_Instr).m_next = (Instr *)0x0;
  (this_00->super_Instr).m_prev = (Instr *)0x0;
  (this_00->super_Instr).m_func = (Func *)0x0;
  (this_00->super_Instr).globOptInstrString = (char16 *)0x0;
  (this_00->super_Instr).m_opcode = MaxByteSizedOpcodes;
  (this_00->super_Instr).ignoreOverflowBitCount = ' ';
  (this_00->super_Instr).highlight = 0;
  puVar1 = &(this_00->super_Instr).field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this_00->super_Instr).field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this_00->super_Instr).m_number = 0xffffffff;
  (this_00->super_Instr).m_dst = (Opnd *)0x0;
  (this_00->super_Instr).m_src1 = (Opnd *)0x0;
  (this_00->super_Instr).m_src2 = (Opnd *)0x0;
  (this_00->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_014ea898;
  Instr::Init((Instr *)this_00,(this->super_Instr).m_opcode,InstrKindProfiled,
              (this->super_Instr).m_func);
  this_00->u = this->u;
  return this_00;
}

Assistant:

ProfiledInstr *
ProfiledInstr::CopyProfiledInstr() const
{
    IR::ProfiledInstr * profiledInstr;

    profiledInstr = JitAnew(this->m_func->m_alloc, IR::ProfiledInstr);
    profiledInstr->Init(this->m_opcode, InstrKindProfiled, this->m_func);
    profiledInstr->u = this->u;

    return profiledInstr;
}